

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::DateTimePatternGenerator::consumeShortTimePattern
          (DateTimePatternGenerator *this,UnicodeString *shortTimePattern,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  UChar *pUVar6;
  char16_t *pcVar7;
  ulong uVar8;
  char16_t c;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  sVar1 = (shortTimePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (shortTimePattern->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (0 < (int)uVar5) {
    uVar8 = 0;
    bVar3 = false;
    do {
      sVar1 = (shortTimePattern->fUnion).fStackFields.fLengthAndFlags;
      uVar2 = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        uVar2 = (shortTimePattern->fUnion).fFields.fLength;
      }
      c = L'\xffff';
      if (uVar8 < uVar2) {
        pcVar7 = (char16_t *)((long)&shortTimePattern->fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar7 = (shortTimePattern->fUnion).fFields.fArray;
        }
        c = pcVar7[uVar8];
        if (c != L'\'') goto LAB_002e6de9;
        bVar3 = !bVar3;
      }
      else {
LAB_002e6de9:
        bVar4 = !bVar3;
        bVar3 = true;
        if (bVar4) {
          pUVar6 = u_strchr_63((UChar *)hourFormatChars,c);
          if (pUVar6 != (UChar *)0x0) {
            this->fDefaultHourFormatChar = c;
            break;
          }
          bVar3 = false;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  hackTimes(this,shortTimePattern,status);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }